

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O0

void __thiscall
TrodesMsg::processArg
          (TrodesMsg *this,char c,vector<unsigned_char,_std::allocator<unsigned_char>_> *a)

{
  string *psVar1;
  size_type sVar2;
  size_t sVar3;
  uchar *__dest;
  byte *__src;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  char in_SIL;
  long in_RDI;
  zframe_t *fr;
  size_type in_stack_ffffffffffffffa8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffb0;
  string *this_00;
  zframe_t *local_38;
  undefined1 local_2d;
  allocator local_19;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  
  if (in_SIL != 'b') {
    local_2d = 1;
    psVar1 = (string *)__cxa_allocate_exception(0x20);
    this_00 = psVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (this_00,"Could not read message. Expected different type, got byte vector",&local_19)
    ;
    local_2d = 0;
    __cxa_throw(psVar1,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  local_18 = in_RDX;
  local_38 = zmsg_pop(*(zmsg_t **)(in_RDI + 0x20));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x389f9c);
  if (local_38 != (zframe_t *)0x0) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_18);
    sVar3 = zframe_size(local_38);
    if (sVar2 != sVar3) {
      zframe_size(local_38);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
    __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x389ff5);
    __src = zframe_data(local_38);
    sVar3 = zframe_size(local_38);
    memcpy(__dest,__src,sVar3);
  }
  zframe_destroy(&local_38);
  return;
}

Assistant:

void TrodesMsg::processArg(const char c, std::vector<byte> &a){
    if(c != 'b') throw std::string(PROCESSERROR "byte vector");
    zframe_t *fr = zmsg_pop(msg);
    a.clear();
    if(fr){
        if(a.size() != zframe_size(fr))
            a.resize(zframe_size(fr));
        memcpy(a.data(), zframe_data(fr), zframe_size(fr));
    }
    zframe_destroy(&fr);
}